

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_recovery.cpp
# Opt level: O3

void __thiscall
RecoveryTest_SigtermTest_Test::~RecoveryTest_SigtermTest_Test(RecoveryTest_SigtermTest_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (RecoveryTest, SigtermTest) {
#ifdef _WIN32
    const char regex[] = "::SigtermHandler";
#else
    const char regex[] = "posixSignalHandler";
#endif

    ASSERT_EXIT(RaiseSigterm(), ::extensions::ExitedOrKilled(CHILLOUT_EXIT_CODE, SIGTERM), regex);
}